

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-table.c
# Opt level: O1

_Bool Curl_uint_tbl_first(uint_tbl *tbl,uint *pkey,void **pentry)

{
  _Bool _Var1;
  ulong uVar2;
  uint uVar3;
  void *pvVar4;
  ulong uVar5;
  bool bVar6;
  
  if (pentry == (void **)0x0 || pkey == (uint *)0x0) {
    return false;
  }
  if (tbl->nentries != 0) {
    uVar5 = (ulong)tbl->nrows;
    uVar3 = 0;
    bVar6 = uVar5 != 0;
    if (uVar5 == 0) {
LAB_00162492:
      pvVar4 = (void *)0x0;
      uVar2 = 0xffffffff;
    }
    else {
      pvVar4 = *tbl->rows;
      _Var1 = true;
      if (pvVar4 != (void *)0x0) goto LAB_001624ad;
      uVar2 = 0;
      do {
        if (uVar5 - 1 == uVar2) {
          bVar6 = uVar2 + 1 < uVar5;
          goto LAB_00162492;
        }
        pvVar4 = tbl->rows[uVar2 + 1];
        uVar2 = uVar2 + 1;
      } while (pvVar4 == (void *)0x0);
      bVar6 = uVar2 < uVar5;
    }
    *pkey = (uint)uVar2;
    *pentry = pvVar4;
    if (bVar6) {
      return true;
    }
  }
  pvVar4 = (void *)0x0;
  uVar3 = 0xffffffff;
  _Var1 = false;
LAB_001624ad:
  *pkey = uVar3;
  *pentry = pvVar4;
  return _Var1;
}

Assistant:

bool Curl_uint_tbl_first(struct uint_tbl *tbl,
                         unsigned int *pkey, void **pentry)
{
  if(!pkey || !pentry)
    return FALSE;
  if(tbl->nentries && uint_tbl_next_at(tbl, 0, pkey, pentry))
    return TRUE;
  DEBUGASSERT(!tbl->nentries);
  *pkey = UINT_MAX;  /* always invalid */
  *pentry = NULL;
  return FALSE;
}